

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

void __thiscall pegmatite::ASTParserDelegate::ASTParserDelegate(ASTParserDelegate *this)

{
  long lVar1;
  
  (this->super_ParserDelegate)._vptr_ParserDelegate = (_func_int **)&PTR_get_parse_proc_00157930;
  (this->handlers)._M_h._M_buckets = &(this->handlers)._M_h._M_single_bucket;
  (this->handlers)._M_h._M_bucket_count = 1;
  (this->handlers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->handlers)._M_h._M_element_count = 0;
  (this->handlers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->handlers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->handlers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar1 = __tls_get_addr(&PTR_00158b00);
  *(ASTParserDelegate **)(lVar1 + 8) = this;
  return;
}

Assistant:

ASTParserDelegate::ASTParserDelegate()
{
	currentParserDelegate = this;
}